

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

bool __thiscall Lexer::is_split_symbol(Lexer *this,char symbol)

{
  undefined1 local_12;
  char symbol_local;
  Lexer *this_local;
  
  local_12 = true;
  if (((((symbol != '+') && (local_12 = true, symbol != '-')) && (local_12 = true, symbol != '/'))
      && (((local_12 = true, symbol != '*' && (local_12 = true, symbol != '(')) &&
          ((local_12 = true, symbol != ')' &&
           ((local_12 = true, symbol != '{' && (local_12 = true, symbol != '}')))))))) &&
     ((local_12 = true, symbol != '\"' &&
      (((((local_12 = true, symbol != ',' && (local_12 = true, symbol != ' ')) &&
         (local_12 = true, symbol != '=')) &&
        ((local_12 = true, symbol != '>' && (local_12 = true, symbol != '<')))) &&
       ((local_12 = true, symbol != ';' && (local_12 = true, symbol != '\t')))))))) {
    local_12 = symbol == '\n';
  }
  return local_12;
}

Assistant:

bool Lexer::is_split_symbol(char symbol)
{
	return symbol == '+' || symbol == '-' ||
		symbol == '/' || symbol == '*' ||
		symbol == '(' || symbol == ')' ||
		symbol == '{' || symbol == '}' ||
		symbol == '\"' || symbol == ',' ||
		symbol == ' ' || symbol == '=' ||
		symbol == '>' || symbol == '<' ||
		symbol == ';' ||
		symbol == 9 || // 9 - Horizontal Tabulation
		symbol == 10; // 10 - Line Feed (enter)
}